

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_lib.cc
# Opt level: O0

SSL_SESSION * SSL_process_tls13_new_session_ticket(SSL *ssl,uint8_t *buf,size_t buf_len)

{
  bool bVar1;
  uint16_t uVar2;
  int iVar3;
  size_t sVar4;
  undefined1 local_58 [8];
  UniquePtr<SSL_SESSION> session;
  uint8_t type;
  CBS body;
  CBS cbs;
  size_t buf_len_local;
  uint8_t *buf_local;
  SSL *ssl_local;
  
  iVar3 = SSL_in_init(ssl);
  if (((iVar3 != 0) || (uVar2 = bssl::ssl_protocol_version(ssl), uVar2 != 0x304)) ||
     ((ssl->field_0xa4 & 1) != 0)) {
    ERR_put_error(0x10,0,0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                  ,0xc39);
    return (SSL_SESSION *)0x0;
  }
  CBS_init((CBS *)&body.len,buf,buf_len);
  iVar3 = CBS_get_u8((CBS *)&body.len,
                     (uint8_t *)
                     ((long)&session._M_t.
                             super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                             super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                             super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl + 7));
  if (((iVar3 != 0) &&
      (iVar3 = CBS_get_u24_length_prefixed((CBS *)&body.len,(CBS *)&stack0xffffffffffffffb8),
      iVar3 != 0)) && (sVar4 = CBS_len((CBS *)&body.len), sVar4 == 0)) {
    bssl::tls13_create_session_with_ticket((SSL *)local_58,(CBS *)ssl);
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_58);
    if (bVar1) {
      ssl_local = (SSL *)std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::release
                                   ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_58)
      ;
    }
    else {
      ssl_local = (SSL *)0x0;
    }
    std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_58);
    return (SSL_SESSION *)ssl_local;
  }
  ERR_put_error(0x10,0,0x89,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_lib.cc"
                ,0xc43);
  return (SSL_SESSION *)0x0;
}

Assistant:

SSL_SESSION *SSL_process_tls13_new_session_ticket(SSL *ssl, const uint8_t *buf,
                                                  size_t buf_len) {
  if (SSL_in_init(ssl) ||                             //
      ssl_protocol_version(ssl) != TLS1_3_VERSION ||  //
      ssl->server) {
    // Only TLS 1.3 clients are supported.
    OPENSSL_PUT_ERROR(SSL, ERR_R_SHOULD_NOT_HAVE_BEEN_CALLED);
    return nullptr;
  }

  CBS cbs, body;
  CBS_init(&cbs, buf, buf_len);
  uint8_t type;
  if (!CBS_get_u8(&cbs, &type) ||                   //
      !CBS_get_u24_length_prefixed(&cbs, &body) ||  //
      CBS_len(&cbs) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return nullptr;
  }

  UniquePtr<SSL_SESSION> session = tls13_create_session_with_ticket(ssl, &body);
  if (!session) {
    // |tls13_create_session_with_ticket| puts the correct error.
    return nullptr;
  }
  return session.release();
}